

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::RegionHandler::handleRemap
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          RegionHandler *this,Vector3d *position,int numberOfChannels)

{
  Scalar SVar1;
  bool bVar2;
  reference_type other;
  Index IVar3;
  Scalar *pSVar4;
  CoeffReturnType piVar5;
  int local_ac;
  undefined1 local_a8 [4];
  int i;
  undefined1 local_90 [8];
  VectorXd out;
  undefined1 local_70 [8];
  VectorXd _pv;
  undefined1 local_48 [8];
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> pv;
  int numberOfChannels_local;
  Vector3d *position_local;
  RegionHandler *this_local;
  
  pv.super_type.m_storage.dummy_._12_4_ = numberOfChannels;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             &_pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             position);
  (**this->_vptr_RegionHandler)
            (local_48,this,
             &_pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  bVar2 = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator!
                    ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_48);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional(__return_storage_ptr__);
  }
  else {
    other = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get
                      ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_48);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_70,other);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              ((ConstantReturnType *)local_a8,(long)(int)pv.super_type.m_storage.dummy_._12_4_);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_90,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_a8);
    local_ac = 0;
    while( true ) {
      IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_70);
      if (IVar3 <= local_ac) break;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_70,
                          (long)local_ac);
      SVar1 = *pSVar4;
      piVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)
                          &this->_outputChannels,(long)local_ac);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_90,
                          (long)*piVar5);
      *pSVar4 = SVar1;
      local_ac = local_ac + 1;
    }
    boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional
              (__return_storage_ptr__,(rval_reference_type)local_90);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_90);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_70);
  }
  boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional
            ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> RegionHandler::handleRemap(
      Eigen::Vector3d position, int numberOfChannels) const {
    boost::optional<Eigen::VectorXd> pv = handle(position);

    if (pv) {
      Eigen::VectorXd _pv = pv.get();
      Eigen::VectorXd out = Eigen::VectorXd::Zero(numberOfChannels);
      for (int i = 0; i < _pv.size(); ++i) {
        out(_outputChannels(i)) = _pv(i);
      }
      return out;
    }
    return boost::none;
  }